

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogL16Encode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  uint8_t *puVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  undefined1 *puVar8;
  bool bVar9;
  long local_88;
  tmsize_t beg;
  int mask;
  int rc;
  tmsize_t occ;
  uint8_t *puStack_68;
  int16_t b;
  int16_t *tp;
  uint8_t *op;
  tmsize_t npixels;
  tmsize_t j;
  tmsize_t i;
  int shft;
  LogLuvState *sp;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *bp_local;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  beg._4_4_ = 0;
  if (s != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1bf,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1c0,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar5 = cc / (long)*(int *)(puVar1 + 0xc);
  puStack_68 = bp;
  if (*(int *)(puVar1 + 4) != 1) {
    puStack_68 = *(uint8_t **)(puVar1 + 0x10);
    if (*(long *)(puVar1 + 0x18) < lVar5) {
      TIFFErrorExtR(tif,"LogL16Encode","Translation buffer too short");
      return 0;
    }
    (**(code **)(puVar1 + 0x20))(puVar1,bp,lVar5);
  }
  tp = (int16_t *)tif->tif_rawcp;
  _mask = tif->tif_rawdatasize - tif->tif_rawcc;
  i._4_4_ = 8;
  do {
    if (i._4_4_ < 0) {
      tif->tif_rawcp = (uint8_t *)tp;
      tif->tif_rawcc = tif->tif_rawdatasize - _mask;
      return 1;
    }
    for (j = 0; j < lVar5; j = beg._4_4_ + j) {
      if (_mask < 4) {
        tif->tif_rawcp = (uint8_t *)tp;
        tif->tif_rawcc = tif->tif_rawdatasize - _mask;
        iVar3 = TIFFFlushData1(tif);
        if (iVar3 == 0) {
          return 0;
        }
        tp = (int16_t *)tif->tif_rawcp;
        _mask = tif->tif_rawdatasize - tif->tif_rawcc;
      }
      bVar6 = (byte)i._4_4_;
      uVar4 = 0xff << (bVar6 & 0x1f);
      for (local_88 = j; local_88 < lVar5; local_88 = beg._4_4_ + local_88) {
        beg._4_4_ = 1;
        while( true ) {
          bVar9 = false;
          if ((beg._4_4_ < 0x81) && (bVar9 = false, local_88 + beg._4_4_ < lVar5)) {
            bVar9 = ((int)*(short *)(puStack_68 + (local_88 + beg._4_4_) * 2) & uVar4) ==
                    (int)(short)(*(ushort *)(puStack_68 + local_88 * 2) & (ushort)uVar4);
          }
          if (!bVar9) break;
          beg._4_4_ = beg._4_4_ + 1;
        }
        if (3 < beg._4_4_) break;
      }
      if ((1 < local_88 - j) && (local_88 - j < 4)) {
        uVar2 = *(ushort *)(puStack_68 + j * 2) & (ushort)uVar4;
        npixels = j + 1;
        do {
          lVar7 = npixels + 1;
          if (((int)*(short *)(puStack_68 + npixels * 2) & uVar4) != (int)(short)uVar2)
          goto LAB_003e705b;
          npixels = lVar7;
        } while (lVar7 != local_88);
        puVar8 = (undefined1 *)((long)tp + 1);
        *(char *)tp = ((char)lVar7 + '~') - (char)j;
        tp = tp + 1;
        *puVar8 = (char)((int)(short)uVar2 >> (bVar6 & 0x1f));
        _mask = _mask + -2;
        j = local_88;
      }
LAB_003e705b:
      while (j < local_88) {
        npixels = local_88 - j;
        if (0x7f < npixels) {
          npixels = 0x7f;
        }
        if (_mask < npixels + 3) {
          tif->tif_rawcp = (uint8_t *)tp;
          tif->tif_rawcc = tif->tif_rawdatasize - _mask;
          iVar3 = TIFFFlushData1(tif);
          if (iVar3 == 0) {
            return 0;
          }
          tp = (int16_t *)tif->tif_rawcp;
          _mask = tif->tif_rawdatasize - tif->tif_rawcc;
        }
        *(char *)tp = (char)npixels;
        while( true ) {
          tp = (int16_t *)((long)tp + 1);
          _mask = _mask + -1;
          if (npixels == 0) break;
          *(char *)tp = (char)((int)*(short *)(puStack_68 + j * 2) >> (bVar6 & 0x1f));
          npixels = npixels + -1;
          j = j + 1;
        }
      }
      if (beg._4_4_ < 4) {
        beg._4_4_ = 0;
      }
      else {
        puVar8 = (undefined1 *)((long)tp + 1);
        *(char *)tp = (char)beg._4_4_ + '~';
        tp = tp + 1;
        *puVar8 = (char)((int)*(short *)(puStack_68 + local_88 * 2) >> (bVar6 & 0x1f));
        _mask = _mask + -2;
      }
    }
    i._4_4_ = i._4_4_ + -8;
  } while( true );
}

Assistant:

static int LogL16Encode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "LogL16Encode";
    LogLuvState *sp = EncoderState(tif);
    int shft;
    tmsize_t i;
    tmsize_t j;
    tmsize_t npixels;
    uint8_t *op;
    int16_t *tp;
    int16_t b;
    tmsize_t occ;
    int rc = 0, mask;
    tmsize_t beg;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);
    npixels = cc / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_16BIT)
        tp = (int16_t *)bp;
    else
    {
        tp = (int16_t *)sp->tbuf;
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        (*sp->tfunc)(sp, bp, npixels);
    }
    /* compress each byte string */
    op = tif->tif_rawcp;
    occ = tif->tif_rawdatasize - tif->tif_rawcc;
    for (shft = 8; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels; i += rc)
        {
            if (occ < 4)
            {
                tif->tif_rawcp = op;
                tif->tif_rawcc = tif->tif_rawdatasize - occ;
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                occ = tif->tif_rawdatasize - tif->tif_rawcc;
            }
            mask = 0xff << shft; /* find next run */
            for (beg = i; beg < npixels; beg += rc)
            {
                b = (int16_t)(tp[beg] & mask);
                rc = 1;
                while (rc < 127 + 2 && beg + rc < npixels &&
                       (tp[beg + rc] & mask) == b)
                    rc++;
                if (rc >= MINRUN)
                    break; /* long enough */
            }
            if (beg - i > 1 && beg - i < MINRUN)
            {
                b = (int16_t)(tp[i] & mask); /*check short run */
                j = i + 1;
                while ((tp[j++] & mask) == b)
                    if (j == beg)
                    {
                        *op++ = (uint8_t)(128 - 2 + j - i);
                        *op++ = (uint8_t)(b >> shft);
                        occ -= 2;
                        i = beg;
                        break;
                    }
            }
            while (i < beg)
            { /* write out non-run */
                if ((j = beg - i) > 127)
                    j = 127;
                if (occ < j + 3)
                {
                    tif->tif_rawcp = op;
                    tif->tif_rawcc = tif->tif_rawdatasize - occ;
                    if (!TIFFFlushData1(tif))
                        return (0);
                    op = tif->tif_rawcp;
                    occ = tif->tif_rawdatasize - tif->tif_rawcc;
                }
                *op++ = (uint8_t)j;
                occ--;
                while (j--)
                {
                    *op++ = (uint8_t)(tp[i++] >> shft & 0xff);
                    occ--;
                }
            }
            if (rc >= MINRUN)
            { /* write out run */
                *op++ = (uint8_t)(128 - 2 + rc);
                *op++ = (uint8_t)(tp[beg] >> shft & 0xff);
                occ -= 2;
            }
            else
                rc = 0;
        }
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = tif->tif_rawdatasize - occ;

    return (1);
}